

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bech32.c
# Opt level: O0

_Bool check_segwit_addr(void)

{
  int iVar1;
  void *local_30;
  char *output;
  _Bool is_success;
  undefined8 uStack_20;
  int ret;
  size_t written;
  uchar *mem;
  
  written = (size_t)calloc(0x5a,1);
  output._3_1_ = 1;
  local_30 = (void *)0x0;
  if ((void *)written == (void *)0x0) {
    mem._7_1_ = false;
  }
  else {
    output._4_4_ = wally_hex_to_bytes("0014751e76e8199196d454941c45d1b3a323f1433bd6",written,0x5a,
                                      &stack0xffffffffffffffe0);
    if (output._4_4_ == 0) {
      output._4_4_ = wally_addr_segwit_from_bytes(written,uStack_20,"bc",0,&local_30);
      if (output._4_4_ == 0) {
        iVar1 = memcmp(local_30,"bc1qw508d6qejxtdg4y5r3zarvary0c5xw7kv8f3t4",0x2b);
        if (iVar1 != 0) {
          output._3_1_ = 0;
        }
        wally_free_string(local_30);
      }
      else {
        output._3_1_ = 0;
      }
    }
    else {
      output._3_1_ = 0;
    }
    output._4_4_ = wally_hex_to_bytes("00201863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262"
                                      ,written,0x5a,&stack0xffffffffffffffe0);
    if (output._4_4_ == 0) {
      output._4_4_ = wally_addr_segwit_from_bytes(written,uStack_20,"tb",0,&local_30);
      if (output._4_4_ == 0) {
        iVar1 = memcmp(local_30,"tb1qrp33g0q5c5txsp9arysrx4k6zdkfs4nce4xj0gdcccefvpysxf3q0sl5k7",
                       0x3f);
        if (iVar1 != 0) {
          output._3_1_ = 0;
        }
        wally_free_string(local_30);
      }
      else {
        output._3_1_ = 0;
      }
    }
    else {
      output._3_1_ = 0;
    }
    output._4_4_ = wally_hex_to_bytes("0014751e76e8199196d454941c45d1b3a323f1433bd6",written,0x5a,
                                      &stack0xffffffffffffffe0);
    if (output._4_4_ == 0) {
      output._4_4_ = wally_addr_segwit_from_bytes(written,uStack_20,"bc",0,&local_30);
      if (output._4_4_ == 0) {
        iVar1 = memcmp(local_30,"bc1qw508d6qejxtdg4y5r3zarvary0c5xw7kv8f3t4",0x2b);
        if (iVar1 != 0) {
          output._3_1_ = 0;
        }
        wally_free_string(local_30);
      }
      else {
        output._3_1_ = 0;
      }
    }
    else {
      output._3_1_ = 0;
    }
    output._4_4_ = wally_hex_to_bytes("5128751e76e8199196d454941c45d1b3a323f1433bd6751e76e8199196d454941c45d1b3a323f1433bd6"
                                      ,written,0x5a,&stack0xffffffffffffffe0);
    if (output._4_4_ == 0) {
      output._4_4_ = wally_addr_segwit_from_bytes(written,uStack_20,"bc",0,&local_30);
      if (output._4_4_ == 0) {
        iVar1 = memcmp(local_30,
                       "bc1pw508d6qejxtdg4y5r3zarvary0c5xw7kw508d6qejxtdg4y5r3zarvary0c5xw7kt5nd6y",
                       0x4b);
        if (iVar1 != 0) {
          output._3_1_ = 0;
        }
        wally_free_string(local_30);
      }
      else {
        output._3_1_ = 0;
      }
    }
    else {
      output._3_1_ = 0;
    }
    output._4_4_ = wally_hex_to_bytes("6002751e",written,0x5a,&stack0xffffffffffffffe0);
    if (output._4_4_ == 0) {
      output._4_4_ = wally_addr_segwit_from_bytes(written,uStack_20,"bc",0,&local_30);
      if (output._4_4_ == 0) {
        iVar1 = memcmp(local_30,"bc1sw50qgdz25j",0xf);
        if (iVar1 != 0) {
          output._3_1_ = 0;
        }
        wally_free_string(local_30);
      }
      else {
        output._3_1_ = 0;
      }
    }
    else {
      output._3_1_ = 0;
    }
    output._4_4_ = wally_hex_to_bytes("5210751e76e8199196d454941c45d1b3a323",written,0x5a,
                                      &stack0xffffffffffffffe0);
    if (output._4_4_ == 0) {
      output._4_4_ = wally_addr_segwit_from_bytes(written,uStack_20,"bc",0,&local_30);
      if (output._4_4_ == 0) {
        iVar1 = memcmp(local_30,"bc1zw508d6qejxtdg4y5r3zarvaryvaxxpcs",0x25);
        if (iVar1 != 0) {
          output._3_1_ = 0;
        }
        wally_free_string(local_30);
      }
      else {
        output._3_1_ = 0;
      }
    }
    else {
      output._3_1_ = 0;
    }
    output._4_4_ = wally_hex_to_bytes("0020000000c4a5cad46221b2a187905e5266362b99d5e91c6ce24d165dab93e86433"
                                      ,written,0x5a,&stack0xffffffffffffffe0);
    if (output._4_4_ == 0) {
      output._4_4_ = wally_addr_segwit_from_bytes(written,uStack_20,"tb",0,&local_30);
      if (output._4_4_ == 0) {
        iVar1 = memcmp(local_30,"tb1qqqqqp399et2xygdj5xreqhjjvcmzhxw4aywxecjdzew6hylgvsesrxh6hy",
                       0x3f);
        if (iVar1 != 0) {
          output._3_1_ = 0;
        }
        wally_free_string(local_30);
      }
      else {
        output._3_1_ = 0;
      }
    }
    else {
      output._3_1_ = 0;
    }
    output._4_4_ = wally_hex_to_bytes("5120000000c4a5cad46221b2a187905e5266362b99d5e91c6ce24d165dab93e86433"
                                      ,written,0x5a,&stack0xffffffffffffffe0);
    if (output._4_4_ == 0) {
      output._4_4_ = wally_addr_segwit_from_bytes(written,uStack_20,"tb",0,&local_30);
      if (output._4_4_ == 0) {
        iVar1 = memcmp(local_30,"tb1pqqqqp399et2xygdj5xreqhjjvcmzhxw4aywxecjdzew6hylgvsesf3hn0c",
                       0x3f);
        if (iVar1 != 0) {
          output._3_1_ = 0;
        }
        wally_free_string(local_30);
      }
      else {
        output._3_1_ = 0;
      }
    }
    else {
      output._3_1_ = 0;
    }
    output._4_4_ = wally_hex_to_bytes("512079be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798"
                                      ,written,0x5a,&stack0xffffffffffffffe0);
    if (output._4_4_ == 0) {
      output._4_4_ = wally_addr_segwit_from_bytes(written,uStack_20,"bc",0,&local_30);
      if (output._4_4_ == 0) {
        iVar1 = memcmp(local_30,"bc1p0xlxvlhemja6c4dqv22uapctqupfhlxm9h8z3k2e72q4k9hcz7vqzk5jj0",
                       0x3f);
        if (iVar1 != 0) {
          output._3_1_ = 0;
        }
        wally_free_string(local_30);
      }
      else {
        output._3_1_ = 0;
      }
    }
    else {
      output._3_1_ = 0;
    }
    free((void *)written);
    mem._7_1_ = (_Bool)(output._3_1_ & 1);
  }
  return mem._7_1_;
}

Assistant:

static bool check_segwit_addr(void)
{
    unsigned char *mem = calloc(90, sizeof(unsigned char));
    size_t written;
    int ret;
    bool is_success = true;
    char *output = NULL;
    
    if (!mem)
        return false;

    ret = wally_hex_to_bytes("0014751e76e8199196d454941c45d1b3a323f1433bd6", mem, 90, &written);
    if (ret != WALLY_OK)
        is_success = false;
    else {
        ret = wally_addr_segwit_from_bytes(mem, written, "bc", 0, &output);
        if (ret != WALLY_OK)
            is_success = false;
        else {
            if (memcmp(output, "bc1qw508d6qejxtdg4y5r3zarvary0c5xw7kv8f3t4", 43) != 0)
                is_success = false;
            wally_free_string(output);
        }
    }

    ret = wally_hex_to_bytes("00201863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262", mem, 90, &written);
    if (ret != WALLY_OK)
        is_success = false;
    else {
        ret = wally_addr_segwit_from_bytes(mem, written, "tb", 0, &output);
        if (ret != WALLY_OK)
            is_success = false;
        else {
            if (memcmp(output, "tb1qrp33g0q5c5txsp9arysrx4k6zdkfs4nce4xj0gdcccefvpysxf3q0sl5k7", 63) != 0)
                is_success = false;
            wally_free_string(output);
        }
    }

    ret = wally_hex_to_bytes("0014751e76e8199196d454941c45d1b3a323f1433bd6", mem, 90, &written);
    if (ret != WALLY_OK)
        is_success = false;
    else {
        ret = wally_addr_segwit_from_bytes(mem, written, "bc", 0, &output);
        if (ret != WALLY_OK)
            is_success = false;
        else {
            if (memcmp(output, "bc1qw508d6qejxtdg4y5r3zarvary0c5xw7kv8f3t4", 43) != 0)
                is_success = false;
            wally_free_string(output);
        }
    }

    ret = wally_hex_to_bytes("5128751e76e8199196d454941c45d1b3a323f1433bd6751e76e8199196d454941c45d1b3a323f1433bd6", mem, 90, &written);
    if (ret != WALLY_OK)
        is_success = false;
    else {
        ret = wally_addr_segwit_from_bytes(mem, written, "bc", 0, &output);
        if (ret != WALLY_OK)
            is_success = false;
        else {
            if (memcmp(output, "bc1pw508d6qejxtdg4y5r3zarvary0c5xw7kw508d6qejxtdg4y5r3zarvary0c5xw7kt5nd6y", 75) != 0)
                is_success = false;
            wally_free_string(output);
        }
    }

    ret = wally_hex_to_bytes("6002751e", mem, 90, &written);
    if (ret != WALLY_OK)
        is_success = false;
    else {
        ret = wally_addr_segwit_from_bytes(mem, written, "bc", 0, &output);
        if (ret != WALLY_OK)
            is_success = false;
        else {
            if (memcmp(output, "bc1sw50qgdz25j", 15) != 0)
                is_success = false;
            wally_free_string(output);
        }
    }

    ret = wally_hex_to_bytes("5210751e76e8199196d454941c45d1b3a323", mem, 90, &written);
    if (ret != WALLY_OK)
        is_success = false;
    else {
        ret = wally_addr_segwit_from_bytes(mem, written, "bc", 0, &output);
        if (ret != WALLY_OK)
            is_success = false;
        else {
            if (memcmp(output, "bc1zw508d6qejxtdg4y5r3zarvaryvaxxpcs", 37) != 0)
                is_success = false;
            wally_free_string(output);
        }
    }

    ret = wally_hex_to_bytes("0020000000c4a5cad46221b2a187905e5266362b99d5e91c6ce24d165dab93e86433", mem, 90, &written);
    if (ret != WALLY_OK)
        is_success = false;
    else {
        ret = wally_addr_segwit_from_bytes(mem, written, "tb", 0, &output);
        if (ret != WALLY_OK)
            is_success = false;
        else {
            if (memcmp(output, "tb1qqqqqp399et2xygdj5xreqhjjvcmzhxw4aywxecjdzew6hylgvsesrxh6hy", 63) != 0)
                is_success = false;
            wally_free_string(output);
        }
    }

    ret = wally_hex_to_bytes("5120000000c4a5cad46221b2a187905e5266362b99d5e91c6ce24d165dab93e86433", mem, 90, &written);
    if (ret != WALLY_OK)
        is_success = false;
    else {
        ret = wally_addr_segwit_from_bytes(mem, written, "tb", 0, &output);
        if (ret != WALLY_OK)
            is_success = false;
        else {
            if (memcmp(output, "tb1pqqqqp399et2xygdj5xreqhjjvcmzhxw4aywxecjdzew6hylgvsesf3hn0c", 63) != 0)
                is_success = false;
            wally_free_string(output);
        }
    }

    ret = wally_hex_to_bytes("512079be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798", mem, 90, &written);
    if (ret != WALLY_OK)
        is_success = false;
    else {
        ret = wally_addr_segwit_from_bytes(mem, written, "bc", 0, &output);
        if (ret != WALLY_OK)
            is_success = false;
        else {
            if (memcmp(output, "bc1p0xlxvlhemja6c4dqv22uapctqupfhlxm9h8z3k2e72q4k9hcz7vqzk5jj0", 63) != 0)
                is_success = false;
            wally_free_string(output);
        }
    }

    free(mem);

    return is_success;
}